

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O2

void __thiscall CVmObjTable::gc_before_alloc(CVmObjTable *this)

{
  gc_pass_init(this);
  gc_pass_finish(this);
  return;
}

Assistant:

void CVmObjTable::gc_before_alloc(VMG0_)
{
    /* count it if in statistics mode */
    IF_GC_STATS(gc_stats.begin_pass());

    /* run a full garbage collection pass */
    gc_pass_init(vmg0_);
    gc_pass_finish(vmg0_);

    /* count it if in statistics mode */
    IF_GC_STATS(gc_stats.end_pass());
}